

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * __thiscall cmTarget::GetSuffixVariableInternal(cmTarget *this,bool implib)

{
  bool bVar1;
  char *pcVar2;
  string local_38;
  
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    if (implib) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    else if (this->IsAndroid == true) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ANDROID_GUI","");
      pcVar2 = GetProperty(this,&local_38,this->Makefile);
      bVar1 = cmSystemTools::IsOn(pcVar2);
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
      if (bVar1) {
        pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
    }
    break;
  case STATIC_LIBRARY:
    pcVar2 = "CMAKE_STATIC_LIBRARY_SUFFIX";
    break;
  case SHARED_LIBRARY:
    pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
    goto LAB_0028d878;
  case MODULE_LIBRARY:
    pcVar2 = "CMAKE_SHARED_MODULE_SUFFIX";
LAB_0028d878:
    if (implib) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    break;
  default:
    pcVar2 = "";
  }
  return pcVar2;
}

Assistant:

void cmTarget::SetType(cmState::TargetType type, const std::string& name)
{
  this->Name = name;
  // only add dependency information for library targets
  this->TargetTypeValue = type;
  if(this->TargetTypeValue >= cmState::STATIC_LIBRARY
     && this->TargetTypeValue <= cmState::MODULE_LIBRARY)
    {
    this->RecordDependencies = true;
    }
  else
    {
    this->RecordDependencies = false;
    }
}